

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSON.cxx
# Opt level: O2

bool cmCMakePresetsGraphInternal::PresetVectorStringHelper
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *out,Value *value,cmJSONState *state)

{
  bool bVar1;
  int iVar2;
  code *local_38 [2];
  code *local_28;
  code *local_20;
  
  if (PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
      ::helper_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                                 ::helper_abi_cxx11_);
    if (iVar2 != 0) {
      local_38[1] = (code *)0x0;
      local_38[0] = cmCMakePresetsErrors::INVALID_PRESET;
      local_20 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(const_Json::Value_*,_cmJSONState_*),_void_(*)(const_Json::Value_*,_cmJSONState_*)>
                 ::_M_manager;
      cmJSONHelperBuilder::
      VectorFilter<std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*),cmJSONHelperBuilder::Vector<std::__cxx11::string,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*)>(std::function<void(Json::Value_const*,cmJSONState*)>,bool(*)(std::__cxx11::string&,Json::Value_const*,cmJSONState*))::_lambda(std::__cxx11::string_const&)_1_>
                (&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                  ::helper_abi_cxx11_,(cmJSONHelperBuilder *)local_38,PresetStringHelper);
      std::_Function_base::~_Function_base((_Function_base *)local_38);
      __cxa_atexit(std::_Function_base::~_Function_base,
                   &PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                    ::helper_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                           ::helper_abi_cxx11_);
    }
  }
  bVar1 = std::
          function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_const_Json::Value_*,_cmJSONState_*)>
          ::operator()(&PresetVectorStringHelper(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,Json::Value_const*,cmJSONState*)
                        ::helper_abi_cxx11_,out,value,state);
  return bVar1;
}

Assistant:

bool PresetVectorStringHelper(std::vector<std::string>& out,
                              const Json::Value* value, cmJSONState* state)
{
  static auto const helper = JSONHelperBuilder::Vector<std::string>(
    cmCMakePresetsErrors::INVALID_PRESET,
    cmCMakePresetsGraphInternal::PresetStringHelper);
  return helper(out, value, state);
}